

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O1

void __thiscall TestMeter::TestMeter(TestMeter *this,Meter *meter)

{
  ulong uVar1;
  TestMetrics *pTVar2;
  TestMetrics **ppTVar3;
  long lVar4;
  _Hash_node_base *p_Var5;
  
  this->nexamples = meter->nexamples_;
  this->nlabels = (meter->labelMetrics_)._M_h._M_element_count;
  this->sourceMeter = meter;
  pTVar2 = (TestMetrics *)operator_new(0x30);
  TestMetrics::TestMetrics(pTVar2,-1,&meter->metrics_);
  this->metrics = pTVar2;
  uVar1 = this->nlabels;
  if (uVar1 == 0) {
    this->labelMetrics = (TestMetrics **)0x0;
  }
  else {
    ppTVar3 = (TestMetrics **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    this->labelMetrics = ppTVar3;
    p_Var5 = (meter->labelMetrics_)._M_h._M_before_begin._M_nxt;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      lVar4 = 0;
      do {
        pTVar2 = (TestMetrics *)operator_new(0x30);
        TestMetrics::TestMetrics(pTVar2,*(int *)&p_Var5[1]._M_nxt,(Metrics *)(p_Var5 + 2));
        *(TestMetrics **)((long)this->labelMetrics + lVar4) = pTVar2;
        p_Var5 = p_Var5->_M_nxt;
        lVar4 = lVar4 + 8;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

explicit TestMeter(Meter* meter)
    {
        nexamples = meter->nexamples_;
        nlabels = meter->labelMetrics_.size();
        sourceMeter = meter;
        metrics = new TestMetrics(-1, meter->metrics_);

        if (nlabels == 0)
        {
            labelMetrics = nullptr;
            return;
        }

        labelMetrics = new TestMetrics*[nlabels];

        int cnt = -1;
        for (auto& pair : meter->labelMetrics_)
        {
            labelMetrics[++cnt] = new TestMetrics(pair.first, pair.second);
        }
    }